

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dconnected.cpp
# Opt level: O0

bool __thiscall
DReachabilityPropagator::correctDominator
          (DReachabilityPropagator *this,int r,vector<bool,_std::allocator<bool>_> *v,int avoid)

{
  bool bVar1;
  uint uVar2;
  iterator this_00;
  reference piVar3;
  uint in_ECX;
  undefined8 in_RDX;
  uint in_ESI;
  GraphPropagator *in_RDI;
  int o;
  int e;
  iterator __end1;
  iterator __begin1;
  value_type *__range1;
  undefined4 in_stack_ffffffffffffff88;
  int in_stack_ffffffffffffff8c;
  reference local_68;
  undefined4 in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffac;
  int iVar4;
  vector<bool,_std::allocator<bool>_> *in_stack_ffffffffffffffb0;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_48;
  reference local_40;
  reference local_38;
  uint local_24;
  undefined8 local_20;
  uint local_14;
  
  if (in_ESI != in_ECX) {
    local_24 = in_ECX;
    local_20 = in_RDX;
    local_14 = in_ESI;
    local_38 = std::vector<bool,_std::allocator<bool>_>::operator[]
                         (in_stack_ffffffffffffffb0,
                          CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8));
    std::_Bit_reference::operator=(&local_38,true);
    local_40 = std::
               vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
               ::operator[]((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                             *)&in_RDI[3].es.data,(long)(int)local_14);
    local_48._M_current =
         (int *)std::vector<int,_std::allocator<int>_>::begin
                          ((vector<int,_std::allocator<int>_> *)
                           CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
    this_00 = std::vector<int,_std::allocator<int>_>::end
                        ((vector<int,_std::allocator<int>_> *)
                         CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
    while (bVar1 = __gnu_cxx::operator!=
                             ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
                              in_RDI,(__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>
                                      *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88
                                                )), bVar1) {
      piVar3 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
               operator*(&local_48);
      iVar4 = *piVar3;
      GraphPropagator::getEdgeVar(in_RDI,in_stack_ffffffffffffff8c);
      bVar1 = BoolView::isFixed((BoolView *)0x2abaf3);
      if (bVar1) {
        GraphPropagator::getEdgeVar(in_RDI,in_stack_ffffffffffffff8c);
        bVar1 = BoolView::isFalse((BoolView *)in_RDI);
        if (!bVar1) goto LAB_002abb1a;
      }
      else {
LAB_002abb1a:
        uVar2 = GraphPropagator::getHead(in_RDI,in_stack_ffffffffffffff8c);
        GraphPropagator::getNodeVar(in_RDI,in_stack_ffffffffffffff8c);
        bVar1 = BoolView::isFixed((BoolView *)0x2abb42);
        if (bVar1) {
          GraphPropagator::getNodeVar(in_RDI,in_stack_ffffffffffffff8c);
          bVar1 = BoolView::isFalse((BoolView *)in_RDI);
          if (bVar1) goto LAB_002abbb5;
        }
        if (uVar2 != local_24) {
          local_68 = std::vector<bool,_std::allocator<bool>_>::operator[]
                               ((vector<bool,_std::allocator<bool>_> *)this_00._M_current,
                                CONCAT44(iVar4,uVar2));
          bVar1 = std::_Bit_reference::operator_cast_to_bool(&local_68);
          if (!bVar1) {
            (*(in_RDI->super_Propagator)._vptr_Propagator[0xf])
                      (in_RDI,(ulong)uVar2,local_20,(ulong)local_24);
          }
        }
      }
LAB_002abbb5:
      __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
                (&local_48);
    }
  }
  return true;
}

Assistant:

bool DReachabilityPropagator::correctDominator(int r, std::vector<bool>& v, int avoid) {
	if (r == avoid) {
		return true;
	}
	v[r] = true;
	if (DEBUG) {
		std::cout << "Visiting " << r << " " << avoid << " who is "
							<< (getNodeVar(r).isFixed() ? (getNodeVar(r).isTrue() ? "in" : "out") : "unfixed")
							<< '\n';
	}
	for (const int e : ou[r]) {
		if (getEdgeVar(e).isFixed() && getEdgeVar(e).isFalse()) {
			continue;
		}
		const int o = getHead(e);
		if (getNodeVar(o).isFixed() && getNodeVar(o).isFalse()) {
			continue;
		}
		if (o == avoid) {
			continue;
		}
		if (v[o]) {
			continue;
		}
		correctDominator(o, v, avoid);
	}
	return true;
}